

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest1::iterate(NegativeTest1 *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  long lVar6;
  GLint temp_length;
  GLuint temp_value;
  GLuint index;
  GLint temp_values;
  GLuint valid_subroutine_locations [2];
  GLuint invalid_subroutine_indices [4];
  GLuint invalid_subroutine_indices2 [2];
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  GLuint local_1d0 [4];
  int local_1c0;
  int local_1bc;
  GLuint local_1b8;
  GLuint local_1b4;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  (**(code **)(lVar5 + 0xa90))(this->m_po_not_linked_id,0x8b30,"subroutine_uniform_name");
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetSubroutineUniformLocation() does not generate GL_INVALID_OPERATION error code when called for a non-linked program object."
               ,0x7f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  local_1e0 = 0;
  local_1d4 = 0;
  (**(code **)(lVar5 + 0x748))(this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms,0x8e4a);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    (**(code **)(lVar5 + 0x748))
              (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms + 1,0x8e4a,&local_1d4);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x501) goto LAB_0098b779;
  }
  else {
LAB_0098b779:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetActiveSubroutineUniformiv() does not generate GL_INVALID_VALUE when passed <index> argument that is greater than or equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
               ,0xad);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  (**(code **)(lVar5 + 0x740))
            (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms,0,&local_1e0,0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    (**(code **)(lVar5 + 0x740))
              (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms + 1,0,&local_1e0,0);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x501) goto LAB_0098b844;
  }
  else {
LAB_0098b844:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetActiveSubroutineUniformName() does not generate GL_INVALID_VALUE when passed <index> argument that is greater than or equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
               ,0xaf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  (**(code **)(lVar5 + 0x738))(this->m_po_id,0x8b31,this->m_po_active_subroutines,0,&local_1e0,0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    (**(code **)(lVar5 + 0x738))
              (this->m_po_id,0x8b31,this->m_po_active_subroutines + 1,0,&local_1e0,0);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x501) goto LAB_0098b90f;
  }
  else {
LAB_0098b90f:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetActiveSubroutineName() does not generate GL_INVALID_VALUE when passed <index> argument that is greater than or equal to the value of GL_ACTIVE_SUBROUTINES."
               ,0xa0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  local_1d8 = 0;
  (**(code **)(lVar5 + 0x1680))(this->m_po_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2a79);
  (**(code **)(lVar5 + 0x1668))
            (0x8b31,this->m_po_active_subroutine_uniform_locations + -1,&local_1d8);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    (**(code **)(lVar5 + 0x1668))
              (0x8b31,this->m_po_active_subroutine_uniform_locations + 1,&local_1d8);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x501) goto LAB_0098b9f5;
  }
  else {
LAB_0098b9f5:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glUniformSubroutinesiv() does not generate GL_INVALID_VALUE when passed <count> argument that is not equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
               ,0xa2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  local_1d0[2] = this->m_po_active_subroutines;
  local_1c0 = local_1d0[2] + 1;
  local_1d0[3] = local_1d0[2];
  local_1bc = local_1c0;
  (**(code **)(lVar5 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    (**(code **)(lVar5 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations,&local_1c0);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x501) goto LAB_0098bab3;
  }
  else {
LAB_0098bab3:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glUniformSubroutinesuiv() does not generate GL_INVALID_VALUE when the value passed via <indices> argument is greater than or equal to the value of GL_ACTIVE_SUBROUTINES."
               ,0xa9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  local_1b8 = this->m_po_subroutine_test1_index;
  local_1b4 = local_1b8;
  (**(code **)(lVar5 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION when the subroutine index passed via <indices> argument identifiesa subroutine not associated with the type of the subroutine uniform assigned to the corresponding location."
               ,0xee);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  local_1d0[0] = 0;
  local_1d0[1] = 0;
  local_1d0[this->m_po_subroutine_uniform_function_index] = this->m_po_subroutine_test1_index;
  local_1d0[this->m_po_subroutine_uniform_function2_index] = this->m_po_subroutine_test3_index;
  (**(code **)(lVar5 + 0x1680))(0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2acc);
  (**(code **)(lVar5 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations,local_1d0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION when called without an active program object."
               ,0x6e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  local_1dc = 0;
  (**(code **)(lVar5 + 0x1680))(this->m_po_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2ae2);
  (**(code **)(lVar5 + 0xb50))(0x8b31,this->m_po_active_subroutine_uniform_locations,&local_1dc);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    (**(code **)(lVar5 + 0xb50))
              (0x8b31,this->m_po_active_subroutine_uniform_locations + 1,&local_1dc);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 == 0x501) goto LAB_0098bd6b;
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "glGetUniformSubroutineuiv() does not generate GL_INVALID_VALUE when called for location that is greater than or equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
             ,0xad);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  this->m_has_test_passed = false;
LAB_0098bd6b:
  poVar1 = (ostringstream *)(local_1b0 + 8);
  lVar6 = 0;
  do {
    (**(code **)(lVar5 + 0xb50))(*(undefined4 *)((long)&DAT_01a9ad90 + lVar6),0,&local_1dc);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x502) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "glGetUniformSubroutineuiv() does not generate GL_INVALID_OPERATION when called for a shader stage that is not defined for active program object."
                 ,0x90);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this->m_has_test_passed = false;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  bVar2 = this->m_has_test_passed == false;
  if (bVar2) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar2,description)
  ;
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NegativeTest1::iterate()
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Initialize GL objects required to run the test */
	initTest();

	/* The error INVALID_OPERATION is generated by GetSubroutineUniformLocation
	 * if the program object identified by <program> has not been successfully
	 * linked.
	 */
	gl.getSubroutineUniformLocation(m_po_not_linked_id, GL_FRAGMENT_SHADER, "subroutine_uniform_name");

	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetSubroutineUniformLocation() does not generate GL_INVALID_OPERATION "
							  "error code when called for a non-linked program object."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by GetActiveSubroutineUniformiv or
	 * GetActiveSubroutineUniformName if <index> is greater than or equal to the
	 * value of ACTIVE_SUBROUTINE_UNIFORMS for the shader stage.
	 */
	glw::GLint temp_length = 0;
	glw::GLint temp_values = 0;

	gl.getActiveSubroutineUniformiv(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms,
									GL_NUM_COMPATIBLE_SUBROUTINES, &temp_values);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getActiveSubroutineUniformiv(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms + 1,
										GL_NUM_COMPATIBLE_SUBROUTINES, &temp_values);

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveSubroutineUniformiv() does not generate GL_INVALID_VALUE "
							  "when passed <index> argument that is greater than or equal to "
							  "the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms, 0, /* bufsize */
									  &temp_length, DE_NULL);										 /* name */
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms + 1,
										  0,					  /* bufsize */
										  &temp_length, DE_NULL); /* name */

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveSubroutineUniformName() does not generate GL_INVALID_VALUE "
							  "when passed <index> argument that is greater than or equal to "
							  "the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by GetActiveSubroutineName if <index>
	 * is greater than or equal to the value of ACTIVE_SUBROUTINES for the shader
	 * stage.
	 */
	gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutines, 0, /* bufsize */
							   &temp_length, DE_NULL);								  /* name */
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutines + 1, 0, /* bufsize */
								   &temp_length, DE_NULL);									  /* name */

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetActiveSubroutineName() does not generate GL_INVALID_VALUE "
													   "when passed <index> argument that is greater than or equal to "
													   "the value of GL_ACTIVE_SUBROUTINES."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by UniformSubroutinesuiv if <count>
	 * is not equal to the value of ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS for the
	 * shader stage <shadertype>.
	 */
	glw::GLuint index = 0;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations - 1, &index);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations + 1, &index);

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glUniformSubroutinesiv() does not generate GL_INVALID_VALUE "
													   "when passed <count> argument that is not equal to the value of "
													   "GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by UniformSubroutinesuiv if any value
	 * in <indices> is greater than or equal to the value of ACTIVE_SUBROUTINES
	 * for the shader stage.
	 */
	glw::GLuint invalid_subroutine_indices[4] = { (GLuint)m_po_active_subroutines, (GLuint)m_po_active_subroutines,
												  (GLuint)m_po_active_subroutines + 1,
												  (GLuint)m_po_active_subroutines + 1 };

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, /* count */
							 invalid_subroutine_indices + 0);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations,
								 invalid_subroutine_indices + 2);

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glUniformSubroutinesuiv() does not generate GL_INVALID_VALUE "
													   "when the value passed via <indices> argument is greater than "
													   "or equal to the value of GL_ACTIVE_SUBROUTINES."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_OPERATION is generated by UniformSubroutinesuiv() if any
	 * subroutine index in <indices> identifies a subroutine not associated with
	 * the type of the subroutine uniform variable assigned to the corresponding
	 * location.
	 */
	glw::GLuint invalid_subroutine_indices2[2] = { m_po_subroutine_test1_index, m_po_subroutine_test1_index };

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, invalid_subroutine_indices2);
	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION "
							  "when the subroutine index passed via <indices> argument identifies"
							  "a subroutine not associated with the type of the subroutine uniform "
							  "assigned to the corresponding location."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_OPERATION is generated by UniformSubroutinesuiv if no
	 * program is active.
	 */
	glw::GLuint valid_subroutine_locations[2] = { 0 };

	valid_subroutine_locations[m_po_subroutine_uniform_function_index]  = m_po_subroutine_test1_index;
	valid_subroutine_locations[m_po_subroutine_uniform_function2_index] = m_po_subroutine_test3_index;

	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, valid_subroutine_locations);
	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION "
							  "when called without an active program object."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by GetUniformSubroutineuiv if
	 * <location> is greater than or equal to the value of
	 * ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS for the shader stage.
	 */
	glw::GLuint temp_value = 0;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, &temp_value);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations + 1, &temp_value);
		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetUniformSubroutineuiv() does not generate GL_INVALID_VALUE "
							  "when called for location that is greater than or equal to the value "
							  "of GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_OPERATION is generated by GetUniformSubroutineuiv if no
	 * program is active for the shader stage identified by <shadertype>.
	 */
	const glw::GLenum undefined_shader_stages[] = { GL_FRAGMENT_SHADER, GL_GEOMETRY_SHADER, GL_TESS_CONTROL_SHADER,
													GL_TESS_EVALUATION_SHADER };
	const unsigned int n_undefined_shader_stages = sizeof(undefined_shader_stages) / sizeof(undefined_shader_stages[0]);

	for (unsigned int n_undefined_shader_stage = 0; n_undefined_shader_stage < n_undefined_shader_stages;
		 ++n_undefined_shader_stage)
	{
		glw::GLenum shader_stage = undefined_shader_stages[n_undefined_shader_stage];

		gl.getUniformSubroutineuiv(shader_stage, 0, /* location */
								   &temp_value);
		error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "glGetUniformSubroutineuiv() does not generate GL_INVALID_OPERATION "
								  "when called for a shader stage that is not defined for active "
								  "program object."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	} /* for (all undefined shader stages) */

	/* All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}